

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

Logger * el::Loggers::reconfigureLogger(string *identity,Configurations *configurations)

{
  Logger *this;
  
  this = base::RegisteredLoggers::get(*(RegisteredLoggers **)(base::elStorage + 0x10),identity,true)
  ;
  if (this == (Logger *)0x0) {
    this = (Logger *)0x0;
  }
  else {
    Logger::configure(this,configurations);
  }
  return this;
}

Assistant:

Logger* Loggers::reconfigureLogger(const std::string& identity, const Configurations& configurations) {
  return Loggers::reconfigureLogger(Loggers::getLogger(identity), configurations);
}